

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O2

int skip_sep(LexState *ls)

{
  size_t sVar1;
  uint c;
  ZIO *pZVar2;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  
  c = ls->current;
  save(ls,c);
  pZVar2 = ls->z;
  sVar1 = pZVar2->n;
  pZVar2->n = pZVar2->n - 1;
  if (sVar1 == 0) {
    uVar4 = luaZ_fill(pZVar2);
  }
  else {
    pbVar3 = (byte *)pZVar2->p;
    pZVar2->p = (char *)(pbVar3 + 1);
    uVar4 = (uint)*pbVar3;
  }
  ls->current = uVar4;
  uVar5 = 0;
  while (uVar4 == 0x3d) {
    save(ls,0x3d);
    pZVar2 = ls->z;
    sVar1 = pZVar2->n;
    pZVar2->n = pZVar2->n - 1;
    if (sVar1 == 0) {
      uVar4 = luaZ_fill(pZVar2);
    }
    else {
      pbVar3 = (byte *)pZVar2->p;
      pZVar2->p = (char *)(pbVar3 + 1);
      uVar4 = (uint)*pbVar3;
    }
    ls->current = uVar4;
    uVar5 = uVar5 + 1;
  }
  return uVar5 ^ -(uint)(uVar4 != c);
}

Assistant:

static int skip_sep(LexState *ls) {
    int count = 0;
    int s = ls->current;
    lua_assert(s == '[' || s == ']');
    save_and_next(ls);
    while (ls->current == '=') {
        save_and_next(ls);
        count++;
    }
    return (ls->current == s) ? count : (-count) - 1;
}